

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

Value * DumpCTestInfo(Value *__return_storage_ptr__,cmCTestRunTest *testRun,
                     cmCTestTestProperties *testProperties,BacktraceData *backtraceGraph)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  Value *pVVar5;
  string *value;
  _Base_ptr p_Var6;
  pointer value_00;
  Value measurement;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  allocator<char> local_489;
  Value *local_488;
  Value properties;
  Value res;
  Value local_430;
  pointer local_408;
  Value local_400;
  Value local_3d8;
  Value local_3b0;
  Value local_388;
  BacktraceData *local_360;
  pointer local_358;
  Value local_350;
  Value local_328;
  Value local_300;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  local_360 = backtraceGraph;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  local_488 = __return_storage_ptr__;
  Json::Value::Value(&measurement,&testProperties->Name);
  pVVar5 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar5,&measurement);
  Json::Value::~Value(&measurement);
  value = cmCTest::GetConfigType_abi_cxx11_(testRun->CTest);
  if (value->_M_string_length != 0) {
    Json::Value::Value(&measurement,value);
    pVVar5 = Json::Value::operator[](local_488,"config");
    Json::Value::operator=(pVVar5,&measurement);
    Json::Value::~Value(&measurement);
  }
  if ((testRun->ActualCommand)._M_string_length != 0) {
    commandAndArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commandAndArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commandAndArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&commandAndArgs,&testRun->ActualCommand);
    pbVar1 = (testRun->Arguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (testRun->Arguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar1 != pbVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&commandAndArgs,((long)pbVar2 - (long)pbVar1 >> 5) + 1);
      cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (&commandAndArgs,&testRun->Arguments);
    }
    DumpToJsonArray(&measurement,&commandAndArgs);
    pVVar5 = Json::Value::operator[](local_488,"command");
    Json::Value::operator=(pVVar5,&measurement);
    Json::Value::~Value(&measurement);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commandAndArgs);
  }
  Json::Value::Value(&properties,arrayValue);
  if ((testProperties->AttachOnFail).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->AttachOnFail).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"ATTACHED_FILES_ON_FAIL",(allocator<char> *)&res);
    DumpToJsonArray(&local_58,&testProperties->AttachOnFail);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_58);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_58);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->AttachedFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->AttachedFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"ATTACHED_FILES",(allocator<char> *)&res);
    DumpToJsonArray(&local_80,&testProperties->AttachedFiles);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_80);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_80);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->Cost != 0.0) || (NAN(testProperties->Cost))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"COST",(allocator<char> *)&res);
    Json::Value::Value(&local_a8,(double)testProperties->Cost);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_a8);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_a8);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"DEPENDS",(allocator<char> *)&res);
    DumpToJsonArray(&local_d0,&testProperties->Depends);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_d0);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_d0);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if (testProperties->Disabled == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"DISABLED",(allocator<char> *)&res);
    Json::Value::Value(&local_f8,testProperties->Disabled);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_f8);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_f8);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"ENVIRONMENT",(allocator<char> *)&res);
    DumpToJsonArray(&local_120,&testProperties->Environment);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_120);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_120);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->EnvironmentModification).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"ENVIRONMENT_MODIFICATION",(allocator<char> *)&res);
    DumpToJsonArray(&local_148,&testProperties->EnvironmentModification);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_148);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_148);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->ErrorRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->ErrorRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"FAIL_REGULAR_EXPRESSION",(allocator<char> *)&res);
    DumpRegExToJsonArray(&local_170,&testProperties->ErrorRegularExpressions);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_170);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_170);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->SkipRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->SkipRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"SKIP_REGULAR_EXPRESSION",(allocator<char> *)&res);
    DumpRegExToJsonArray(&local_198,&testProperties->SkipRegularExpressions);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_198);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_198);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->FixturesCleanup)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"FIXTURES_CLEANUP",(allocator<char> *)&res);
    DumpToJsonArray(&local_1c0,&testProperties->FixturesCleanup);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_1c0);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_1c0);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->FixturesRequired)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"FIXTURES_REQUIRED",(allocator<char> *)&res);
    DumpToJsonArray(&local_1e8,&testProperties->FixturesRequired);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_1e8);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_1e8);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->FixturesSetup)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"FIXTURES_SETUP",(allocator<char> *)&res);
    DumpToJsonArray(&local_210,&testProperties->FixturesSetup);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_210);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_210);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->Labels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"LABELS",(allocator<char> *)&res);
    DumpToJsonArray(&local_238,&testProperties->Labels);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_238);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"MEASUREMENT",(allocator<char> *)&local_260);
    Json::Value::Value(&local_288,arrayValue);
    for (p_Var6 = (testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(testProperties->Measurements)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      Json::Value::Value(&measurement,objectValue);
      Json::Value::Value((Value *)&commandAndArgs,(String *)(p_Var6 + 1));
      pVVar5 = Json::Value::operator[](&measurement,"measurement");
      Json::Value::operator=(pVVar5,(Value *)&commandAndArgs);
      Json::Value::~Value((Value *)&commandAndArgs);
      Json::Value::Value((Value *)&commandAndArgs,(String *)(p_Var6 + 2));
      pVVar5 = Json::Value::operator[](&measurement,"value");
      Json::Value::operator=(pVVar5,(Value *)&commandAndArgs);
      Json::Value::~Value((Value *)&commandAndArgs);
      Json::Value::append(&local_288,&measurement);
      Json::Value::~Value(&measurement);
    }
    DumpCTestProperty(&res,(string *)&local_430,&local_288);
    Json::Value::append(&properties,&res);
    Json::Value::~Value(&res);
    Json::Value::~Value(&local_288);
    std::__cxx11::string::~string((string *)&local_430);
  }
  if ((testProperties->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->RequiredRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&commandAndArgs,"PASS_REGULAR_EXPRESSION",(allocator<char> *)&res);
    DumpRegExToJsonArray(&local_260,&testProperties->RequiredRegularExpressions);
    DumpCTestProperty(&measurement,(string *)&commandAndArgs,&local_260);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_260);
    std::__cxx11::string::~string((string *)&commandAndArgs);
  }
  if ((testProperties->ResourceGroups).
      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->ResourceGroups).
      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"RESOURCE_GROUPS",(allocator<char> *)&local_350);
    Json::Value::Value(&local_2b0,arrayValue);
    local_358 = (testProperties->ResourceGroups).
                super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (local_408 = (testProperties->ResourceGroups).
                     super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; local_408 != local_358;
        local_408 = local_408 + 1) {
      Json::Value::Value(&measurement,objectValue);
      Json::Value::Value((Value *)&commandAndArgs,arrayValue);
      pcVar3 = (local_408->
               super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (value_00 = (local_408->
                      super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                      )._M_impl.super__Vector_impl_data._M_start; value_00 != pcVar3;
          value_00 = value_00 + 1) {
        Json::Value::Value(&res,objectValue);
        Json::Value::Value(&local_430,&value_00->ResourceType);
        pVVar5 = Json::Value::operator[](&res,".type");
        Json::Value::operator=(pVVar5,&local_430);
        Json::Value::~Value(&local_430);
        Json::Value::Value(&local_430,value_00->SlotsNeeded);
        pVVar5 = Json::Value::operator[](&res,"slots");
        Json::Value::operator=(pVVar5,&local_430);
        Json::Value::~Value(&local_430);
        Json::Value::append((Value *)&commandAndArgs,&res);
        Json::Value::~Value(&res);
      }
      pVVar5 = Json::Value::operator[](&measurement,"requirements");
      Json::Value::operator=(pVVar5,(Value *)&commandAndArgs);
      Json::Value::append(&local_2b0,&measurement);
      Json::Value::~Value((Value *)&commandAndArgs);
      Json::Value::~Value(&measurement);
    }
    DumpCTestProperty(&local_3b0,(string *)&local_3d8,&local_2b0);
    Json::Value::append(&properties,&local_3b0);
    Json::Value::~Value(&local_3b0);
    Json::Value::~Value(&local_2b0);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if (testProperties->WantAffinity == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&res,"PROCESSOR_AFFINITY",(allocator<char> *)&local_430);
    Json::Value::Value((Value *)&commandAndArgs,testProperties->WantAffinity);
    DumpCTestProperty(&measurement,(string *)&res,(Value *)&commandAndArgs);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value((Value *)&commandAndArgs);
    std::__cxx11::string::~string((string *)&res);
  }
  if (testProperties->Processors != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"PROCESSORS",(allocator<char> *)&local_3b0);
    Json::Value::Value(&res,testProperties->Processors);
    DumpCTestProperty(&measurement,(string *)&local_430,&res);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&res);
    std::__cxx11::string::~string((string *)&local_430);
  }
  if ((testProperties->RequiredFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->RequiredFiles).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,"REQUIRED_FILES",(allocator<char> *)&local_3d8);
    DumpToJsonArray(&local_430,&testProperties->RequiredFiles);
    DumpCTestProperty(&measurement,(string *)&local_3b0,&local_430);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_430);
    std::__cxx11::string::~string((string *)&local_3b0);
  }
  if ((testProperties->ProjectResources)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3d8,"RESOURCE_LOCK",(allocator<char> *)&local_350);
    DumpToJsonArray(&local_3b0,&testProperties->ProjectResources);
    DumpCTestProperty(&measurement,(string *)&local_3d8,&local_3b0);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_3b0);
    std::__cxx11::string::~string((string *)&local_3d8);
  }
  if (testProperties->RunSerial == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"RUN_SERIAL",(allocator<char> *)&local_328);
    Json::Value::Value(&local_3d8,testProperties->RunSerial);
    DumpCTestProperty(&measurement,(string *)&local_350,&local_3d8);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_3d8);
    std::__cxx11::string::~string((string *)&local_350);
  }
  if (testProperties->SkipReturnCode != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"SKIP_RETURN_CODE",(allocator<char> *)&local_400);
    Json::Value::Value(&local_350,testProperties->SkipReturnCode);
    DumpCTestProperty(&measurement,(string *)&local_328,&local_350);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_350);
    std::__cxx11::string::~string((string *)&local_328);
  }
  if ((testProperties->Timeout).
      super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>.
      _M_payload.super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>.
      _M_engaged == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"TIMEOUT",(allocator<char> *)&local_2d8);
    Json::Value::Value(&local_328,
                       (double)(testProperties->Timeout).
                               super__Optional_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>
                               ._M_payload);
    DumpCTestProperty(&measurement,(string *)&local_400,&local_328);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_328);
    std::__cxx11::string::~string((string *)&local_400);
  }
  if ((testProperties->TimeoutRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (testProperties->TimeoutRegularExpressions).
      super__Vector_base<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"TIMEOUT_AFTER_MATCH",(allocator<char> *)&local_300);
    Json::Value::Value(&local_2d8,objectValue);
    Json::Value::Value(&measurement,(testProperties->AlternateTimeout).__r);
    pVVar5 = Json::Value::operator[](&local_2d8,"timeout");
    Json::Value::operator=(pVVar5,&measurement);
    Json::Value::~Value(&measurement);
    DumpRegExToJsonArray(&measurement,&testProperties->TimeoutRegularExpressions);
    pVVar5 = Json::Value::operator[](&local_2d8,"regex");
    Json::Value::operator=(pVVar5,&measurement);
    Json::Value::~Value(&measurement);
    DumpCTestProperty(&local_400,(string *)&local_388,&local_2d8);
    Json::Value::append(&properties,&local_400);
    Json::Value::~Value(&local_400);
    Json::Value::~Value(&local_2d8);
    std::__cxx11::string::~string((string *)&local_388);
  }
  if (testProperties->WillFail == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_388,"WILL_FAIL",(allocator<char> *)&local_300);
    Json::Value::Value(&local_400,testProperties->WillFail);
    DumpCTestProperty(&measurement,(string *)&local_388,&local_400);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_400);
    std::__cxx11::string::~string((string *)&local_388);
  }
  if ((testProperties->Directory)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"WORKING_DIRECTORY",&local_489);
    Json::Value::Value(&local_388,&testProperties->Directory);
    DumpCTestProperty(&measurement,(string *)&local_300,&local_388);
    Json::Value::append(&properties,&measurement);
    Json::Value::~Value(&measurement);
    Json::Value::~Value(&local_388);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((testProperties->CustomProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    for (p_Var6 = (testProperties->CustomProperties)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(testProperties->CustomProperties)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
      Json::Value::Value(&local_300,(String *)(p_Var6 + 2));
      DumpCTestProperty(&measurement,(string *)(p_Var6 + 1),&local_300);
      Json::Value::append(&properties,&measurement);
      Json::Value::~Value(&measurement);
      Json::Value::~Value(&local_300);
    }
  }
  bVar4 = Json::Value::empty(&properties);
  if (!bVar4) {
    pVVar5 = Json::Value::operator[](local_488,"properties");
    Json::Value::operator=(pVVar5,&properties);
  }
  bVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Empty
                    (&(testProperties->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
  if (!bVar4) {
    bVar4 = BacktraceData::Add(local_360,&testProperties->Backtrace,(ArrayIndex *)&commandAndArgs);
    if (bVar4) {
      Json::Value::Value(&measurement,
                         (UInt)commandAndArgs.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
      pVVar5 = Json::Value::operator[](local_488,"backtrace");
      Json::Value::operator=(pVVar5,&measurement);
      Json::Value::~Value(&measurement);
    }
  }
  Json::Value::~Value(&properties);
  return local_488;
}

Assistant:

static Json::Value DumpCTestInfo(
  cmCTestRunTest& testRun,
  cmCTestTestHandler::cmCTestTestProperties& testProperties,
  BacktraceData& backtraceGraph)
{
  Json::Value testInfo = Json::objectValue;
  // test name should always be present
  testInfo["name"] = testProperties.Name;
  std::string const& config = testRun.GetCTest()->GetConfigType();
  if (!config.empty()) {
    testInfo["config"] = config;
  }
  std::string const& command = testRun.GetActualCommand();
  if (!command.empty()) {
    std::vector<std::string> commandAndArgs;
    commandAndArgs.push_back(command);
    const std::vector<std::string>& args = testRun.GetArguments();
    if (!args.empty()) {
      commandAndArgs.reserve(args.size() + 1);
      cm::append(commandAndArgs, args);
    }
    testInfo["command"] = DumpToJsonArray(commandAndArgs);
  }
  Json::Value properties = DumpCTestProperties(testProperties);
  if (!properties.empty()) {
    testInfo["properties"] = properties;
  }
  if (!testProperties.Backtrace.Empty()) {
    AddBacktrace(backtraceGraph, testInfo, testProperties.Backtrace);
  }
  return testInfo;
}